

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  longlong lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i *palVar12;
  __m128i *palVar13;
  int iVar14;
  int iVar15;
  __m128i *ptr;
  int32_t *ptr_00;
  undefined8 *puVar16;
  int32_t in_R9D;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar25;
  __m128i vH_00;
  __m128i vH_01;
  int32_t in_stack_fffffffffffff9f8;
  ulong local_600;
  int local_5f8;
  long local_5f0;
  int local_5e8;
  int local_5dc;
  ulong uStack_5d8;
  __m128i vH_1;
  int32_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_480;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse41_128_32","s2Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse41_128_32","open")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse41_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_480 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar14 = (iVar1 + 3) / 4;
    pvVar4 = (profile->profile32).score;
    if (-open < ppVar3->min) {
      local_5dc = open + -0x80000000;
    }
    else {
      local_5dc = -0x80000000 - ppVar3->min;
    }
    local_5dc = local_5dc + 1;
    iVar15 = 0x7ffffffe - ppVar3->max;
    vSaturationCheckMax[1] = CONCAT44(iVar15,iVar15);
    vSaturationCheckMin[0] = CONCAT44(iVar15,iVar15);
    result = (parasail_result_t *)CONCAT44(local_5dc,local_5dc);
    vSaturationCheckMax[0] = CONCAT44(local_5dc,local_5dc);
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar14 * 4,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4400801;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar14);
      pvE = parasail_memalign___m128i(0x10,(long)iVar14);
      ptr = parasail_memalign___m128i(0x10,(long)iVar14);
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.v[3] = 0;
        for (k = 0; k < iVar14; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            local_5e8 = -(gap * (h.v[2] * iVar14 + k)) - open;
            local_5f0 = (long)local_5e8;
            if (local_5f0 < -0x80000000) {
              local_5e8 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_5e8;
            local_5f0 = local_5f0 - open;
            if (local_5f0 < -0x80000000) {
              local_5f0 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_5f0;
          }
          pvHLoad[h.v[3]][0] = e.m[1];
          pvHLoad[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_5f8 = -(gap * (k + -1)) - open;
          if (local_5f8 < -0x80000000) {
            local_5f8 = -0x80000000;
          }
          ptr_00[k] = local_5f8;
        }
        for (s1Len = 0; palVar13 = pvHLoad, palVar12 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          uVar25 = pvHLoad[iVar14 + -1][0];
          vH[0] = pvHLoad[iVar14 + -1][1] << 0x20 | uVar25 >> 0x20;
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          pvE = pvHLoad;
          pvHLoad = palVar12;
          vP = (__m128i *)(uVar25 << 0x20 | (ulong)(uint)ptr_00[s1Len]);
          vH[1] = (longlong)CONCAT44(local_5dc,local_5dc);
          vF[0] = CONCAT44(local_5dc,local_5dc);
          for (k = 0; k < iVar14; k = k + 1) {
            puVar16 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar2 * iVar14) * 0x10);
            uVar6 = *puVar16;
            uVar7 = puVar16[1];
            local_388 = (int)vP;
            iStack_384 = (int)((ulong)vP >> 0x20);
            iStack_380 = (int)vH[0];
            iStack_37c = (int)((ulong)vH[0] >> 0x20);
            local_398 = (int)uVar6;
            iStack_394 = (int)((ulong)uVar6 >> 0x20);
            iStack_390 = (int)uVar7;
            iStack_38c = (int)((ulong)uVar7 >> 0x20);
            local_388 = local_388 + local_398;
            iStack_384 = iStack_384 + iStack_394;
            iStack_380 = iStack_380 + iStack_390;
            iStack_37c = iStack_37c + iStack_38c;
            lVar8 = ptr[k][0];
            lVar9 = ptr[k][1];
            local_288 = (int)lVar8;
            iStack_284 = (int)((ulong)lVar8 >> 0x20);
            iStack_280 = (int)lVar9;
            iStack_27c = (int)((ulong)lVar9 >> 0x20);
            uVar17 = (uint)(local_388 < local_288) * local_288 |
                     (uint)(local_388 >= local_288) * local_388;
            uVar19 = (uint)(iStack_384 < iStack_284) * iStack_284 |
                     (uint)(iStack_384 >= iStack_284) * iStack_384;
            uVar22 = (uint)(iStack_380 < iStack_280) * iStack_280 |
                     (uint)(iStack_380 >= iStack_280) * iStack_380;
            uVar26 = (uint)(iStack_37c < iStack_27c) * iStack_27c |
                     (uint)(iStack_37c >= iStack_27c) * iStack_37c;
            local_2a8 = (int)vH[1];
            iStack_2a4 = (int)((ulong)vH[1] >> 0x20);
            iStack_2a0 = (int)vF[0];
            iStack_29c = (int)((ulong)vF[0] >> 0x20);
            uVar17 = (uint)((int)uVar17 < local_2a8) * local_2a8 |
                     ((int)uVar17 >= local_2a8) * uVar17;
            uVar20 = (uint)((int)uVar19 < iStack_2a4) * iStack_2a4 |
                     ((int)uVar19 >= iStack_2a4) * uVar19;
            uVar23 = (uint)((int)uVar22 < iStack_2a0) * iStack_2a0 |
                     ((int)uVar22 >= iStack_2a0) * uVar22;
            uVar27 = (uint)((int)uVar26 < iStack_29c) * iStack_29c |
                     ((int)uVar26 >= iStack_29c) * uVar26;
            vP = (__m128i *)CONCAT44(uVar20,uVar17);
            vH[0] = CONCAT44(uVar27,uVar23);
            palVar12[k][0] = (longlong)vP;
            palVar12[k][1] = vH[0];
            local_2b8 = (int)result;
            iStack_2b4 = (int)((ulong)result >> 0x20);
            iStack_2b0 = (int)vSaturationCheckMax[0];
            iStack_2ac = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            result = (parasail_result_t *)
                     CONCAT44((iStack_2b4 < (int)uVar20) * uVar20 |
                              (uint)(iStack_2b4 >= (int)uVar20) * iStack_2b4,
                              (local_2b8 < (int)uVar17) * uVar17 |
                              (uint)(local_2b8 >= (int)uVar17) * local_2b8);
            vSaturationCheckMax[0] =
                 CONCAT44((iStack_2ac < (int)uVar27) * uVar27 |
                          (uint)(iStack_2ac >= (int)uVar27) * iStack_2ac,
                          (iStack_2b0 < (int)uVar23) * uVar23 |
                          (uint)(iStack_2b0 >= (int)uVar23) * iStack_2b0);
            local_1f8 = (int)vSaturationCheckMax[1];
            iStack_1f4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_1f0 = (int)vSaturationCheckMin[0];
            iStack_1ec = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            uVar19 = ((int)uVar17 < local_1f8) * uVar17 |
                     (uint)((int)uVar17 >= local_1f8) * local_1f8;
            uVar22 = ((int)uVar20 < iStack_1f4) * uVar20 |
                     (uint)((int)uVar20 >= iStack_1f4) * iStack_1f4;
            uVar26 = ((int)uVar23 < iStack_1f0) * uVar23 |
                     (uint)((int)uVar23 >= iStack_1f0) * iStack_1f0;
            uVar28 = ((int)uVar27 < iStack_1ec) * uVar27 |
                     (uint)((int)uVar27 >= iStack_1ec) * iStack_1ec;
            uVar19 = (uint)(local_288 < (int)uVar19) * local_288 |
                     (local_288 >= (int)uVar19) * uVar19;
            uVar22 = (uint)(iStack_284 < (int)uVar22) * iStack_284 |
                     (iStack_284 >= (int)uVar22) * uVar22;
            uVar26 = (uint)(iStack_280 < (int)uVar26) * iStack_280 |
                     (iStack_280 >= (int)uVar26) * uVar26;
            uVar28 = (uint)(iStack_27c < (int)uVar28) * iStack_27c |
                     (iStack_27c >= (int)uVar28) * uVar28;
            vSaturationCheckMax[1] =
                 CONCAT44((uint)(iStack_2a4 < (int)uVar22) * iStack_2a4 |
                          (iStack_2a4 >= (int)uVar22) * uVar22,
                          (uint)(local_2a8 < (int)uVar19) * local_2a8 |
                          (local_2a8 >= (int)uVar19) * uVar19);
            vSaturationCheckMin[0] =
                 CONCAT44((uint)(iStack_29c < (int)uVar28) * iStack_29c |
                          (iStack_29c >= (int)uVar28) * uVar28,
                          (uint)(iStack_2a0 < (int)uVar26) * iStack_2a0 |
                          (iStack_2a0 >= (int)uVar26) * uVar26);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar14;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,vH_00,s1Len,s2Len,in_R9D,in_stack_fffffffffffff9f8);
            iVar18 = uVar17 - open;
            iVar21 = uVar20 - open;
            iVar24 = uVar23 - open;
            iVar29 = uVar27 - open;
            local_288 = local_288 - gap;
            iStack_284 = iStack_284 - gap;
            iStack_280 = iStack_280 - gap;
            iStack_27c = iStack_27c - gap;
            vF[1] = CONCAT44((uint)(iStack_284 < iVar21) * iVar21 |
                             (uint)(iStack_284 >= iVar21) * iStack_284,
                             (uint)(local_288 < iVar18) * iVar18 |
                             (uint)(local_288 >= iVar18) * local_288);
            vE[0] = CONCAT44((uint)(iStack_27c < iVar29) * iVar29 |
                             (uint)(iStack_27c >= iVar29) * iStack_27c,
                             (uint)(iStack_280 < iVar24) * iVar24 |
                             (uint)(iStack_280 >= iVar24) * iStack_280);
            ptr[k][0] = vF[1];
            ptr[k][1] = vE[0];
            local_2a8 = local_2a8 - gap;
            iStack_2a4 = iStack_2a4 - gap;
            iStack_2a0 = iStack_2a0 - gap;
            iStack_29c = iStack_29c - gap;
            vH[1] = CONCAT44((uint)(iStack_2a4 < iVar21) * iVar21 |
                             (uint)(iStack_2a4 >= iVar21) * iStack_2a4,
                             (uint)(local_2a8 < iVar18) * iVar18 |
                             (uint)(local_2a8 >= iVar18) * local_2a8);
            vF[0] = CONCAT44((uint)(iStack_29c < iVar29) * iVar29 |
                             (uint)(iStack_29c >= iVar29) * iStack_29c,
                             (uint)(iStack_2a0 < iVar24) * iVar24 |
                             (uint)(iStack_2a0 >= iVar24) * iStack_2a0);
            vP = (__m128i *)palVar13[k][0];
            vH[0] = palVar13[k][1];
          }
          for (end_query = 0; end_query < 4; end_query = end_query + 1) {
            local_600 = (ulong)(ptr_00[s1Len + 1] - open);
            if ((long)local_600 < -0x80000000) {
              local_600 = 0xffffffff80000000;
            }
            vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
            vH[1] = vH[1] << 0x20 | local_600 & 0xffffffff;
            for (k = 0; k < iVar14; k = k + 1) {
              lVar8 = palVar12[k][0];
              lVar9 = palVar12[k][1];
              local_318 = (int)lVar8;
              iStack_314 = (int)((ulong)lVar8 >> 0x20);
              iStack_310 = (int)lVar9;
              iStack_30c = (int)((ulong)lVar9 >> 0x20);
              local_328 = (int)vH[1];
              iStack_324 = (int)((ulong)vH[1] >> 0x20);
              iStack_320 = (int)vF[0];
              iStack_31c = (int)((ulong)vF[0] >> 0x20);
              uVar17 = (uint)(local_318 < local_328) * local_328 |
                       (uint)(local_318 >= local_328) * local_318;
              uVar19 = (uint)(iStack_314 < iStack_324) * iStack_324 |
                       (uint)(iStack_314 >= iStack_324) * iStack_314;
              uVar20 = (uint)(iStack_310 < iStack_320) * iStack_320 |
                       (uint)(iStack_310 >= iStack_320) * iStack_310;
              uVar22 = (uint)(iStack_30c < iStack_31c) * iStack_31c |
                       (uint)(iStack_30c >= iStack_31c) * iStack_30c;
              vP = (__m128i *)CONCAT44(uVar19,uVar17);
              vH[0] = CONCAT44(uVar22,uVar20);
              palVar12[k][0] = (longlong)vP;
              palVar12[k][1] = vH[0];
              local_258 = (int)vSaturationCheckMax[1];
              iStack_254 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_250 = (int)vSaturationCheckMin[0];
              iStack_24c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              vSaturationCheckMax[1] =
                   CONCAT44(((int)uVar19 < iStack_254) * uVar19 |
                            (uint)((int)uVar19 >= iStack_254) * iStack_254,
                            ((int)uVar17 < local_258) * uVar17 |
                            (uint)((int)uVar17 >= local_258) * local_258);
              vSaturationCheckMin[0] =
                   CONCAT44(((int)uVar22 < iStack_24c) * uVar22 |
                            (uint)((int)uVar22 >= iStack_24c) * iStack_24c,
                            ((int)uVar20 < iStack_250) * uVar20 |
                            (uint)((int)uVar20 >= iStack_250) * iStack_250);
              local_338 = (int)result;
              iStack_334 = (int)((ulong)result >> 0x20);
              iStack_330 = (int)vSaturationCheckMax[0];
              iStack_32c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              result = (parasail_result_t *)
                       CONCAT44((iStack_334 < (int)uVar19) * uVar19 |
                                (uint)(iStack_334 >= (int)uVar19) * iStack_334,
                                (local_338 < (int)uVar17) * uVar17 |
                                (uint)(local_338 >= (int)uVar17) * local_338);
              vSaturationCheckMax[0] =
                   CONCAT44((iStack_32c < (int)uVar22) * uVar22 |
                            (uint)(iStack_32c >= (int)uVar22) * iStack_32c,
                            (iStack_330 < (int)uVar20) * uVar20 |
                            (uint)(iStack_330 >= (int)uVar20) * iStack_330);
              vH_01[0] = (ulong)(uint)k;
              vH_01[1]._0_4_ = iVar14;
              vH_01[1]._4_4_ = 0;
              arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                              rowcols->score_row,vH_01,s1Len,s2Len,in_R9D,in_stack_fffffffffffff9f8)
              ;
              iStack_31c = iStack_31c - gap;
              vH[1] = CONCAT44(iStack_324 - gap,local_328 - gap);
              vF[0] = CONCAT44(iStack_31c,iStack_320 - gap);
              bVar5 = (int)(uVar22 - open) < iStack_31c;
              uVar22 = -(uint)bVar5;
              auVar11._4_4_ = -(uint)((int)(uVar19 - open) < iStack_324 - gap);
              auVar11._0_4_ = -(uint)((int)(uVar17 - open) < local_328 - gap);
              auVar11._8_4_ = -(uint)((int)(uVar20 - open) < iStack_320 - gap);
              auVar11._12_4_ = uVar22;
              if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar11 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar11 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar11 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar11 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar11 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar11 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar11 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar11 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (uVar22 >> 7 & 1) == 0) && (uVar22 >> 0xf & 1) == 0) &&
                  (uVar22 >> 0x17 & 1) == 0) && !bVar5) goto LAB_009920d9;
            }
          }
LAB_009920d9:
        }
        vH_1[0] = pvHLoad[(iVar1 + -1) % iVar14][1];
        uStack_5d8 = pvHLoad[(iVar1 + -1) % iVar14][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar14) + 4U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x20 | uStack_5d8 >> 0x20;
          uStack_5d8 = uStack_5d8 << 0x20;
        }
        vNegLimit[1]._4_4_ = vH_1[0]._4_4_;
        local_a8 = (int)vSaturationCheckMax[1];
        iStack_a4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_a0 = (int)vSaturationCheckMin[0];
        iStack_9c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_118 = (int)result;
        iStack_114 = (int)((ulong)result >> 0x20);
        iStack_110 = (int)vSaturationCheckMax[0];
        iStack_10c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar25 = CONCAT44(-(uint)(iStack_9c < local_5dc),-(uint)(iStack_a0 < local_5dc)) |
                 CONCAT44(-(uint)(iVar15 < iStack_10c),-(uint)(iVar15 < iStack_110));
        auVar10._8_8_ = uVar25;
        auVar10._0_8_ =
             CONCAT44(-(uint)(iStack_a4 < local_5dc),-(uint)(local_a8 < local_5dc)) |
             CONCAT44(-(uint)(iVar15 < iStack_114),-(uint)(iVar15 < local_118));
        if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar25 >> 7 & 1) != 0) || (uVar25 >> 0xf & 1) != 0) || (uVar25 >> 0x17 & 1) != 0)
               || (uVar25 >> 0x1f & 1) != 0) || (uVar25 >> 0x27 & 1) != 0) ||
             (uVar25 >> 0x2f & 1) != 0) || (uVar25 >> 0x37 & 1) != 0) || (long)uVar25 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          vNegLimit[1]._4_4_ = 0;
          local_480 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = vNegLimit[1]._4_4_;
        *(int *)((long)&_segNum->s1 + 4) = local_480;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}